

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v)

{
  ulong uVar1;
  pointer pPVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pPVar2 = (v->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      operator<<(os,(Path *)((long)&(pPVar2->_prim_part)._M_dataplus._M_p + lVar3));
      if (uVar1 != ((long)(v->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5 - 1U)
      {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      pPVar2 = (v->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0xd0;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 4)
                            * 0x4ec4ec4ec4ec4ec5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}